

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O1

void __thiscall
sc_core::sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>::do_update
          (sc_signal<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1> *this)

{
  sc_signal_channel *this_00;
  sc_logic_value_t sVar1;
  long lVar2;
  
  this_00 = &(this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
             super_sc_signal_channel;
  sc_signal_channel::notify_next_delta
            (this_00,(this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
                     super_sc_signal_channel.m_change_event_p);
  (this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).super_sc_signal_channel.
  m_change_stamp =
       ((this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
        super_sc_signal_channel.super_sc_prim_channel.super_sc_object.m_simc)->m_change_stamp;
  sVar1 = (this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).m_new_val.m_val;
  (this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).m_cur_val.m_val = sVar1;
  lVar2 = 0xc0;
  if ((sVar1 != sc_dt::SC_LOGIC_1) && (lVar2 = 0xb8, sVar1 != sc_dt::SC_LOGIC_0)) {
    return;
  }
  sc_signal_channel::notify_next_delta
            (this_00,*(sc_event **)
                      (&(this->super_sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)1>).
                        super_sc_signal_inout_if<sc_dt::sc_logic>.
                        super_sc_signal_in_if<sc_dt::sc_logic>.field_0x0 + lVar2));
  return;
}

Assistant:

void
sc_signal<sc_logic,POL>::do_update()
{
    base_type::do_update();

    if( this->m_cur_val == sc_dt::SC_LOGIC_1 ) {
        sc_signal_channel::notify_next_delta( m_posedge_event_p );
    }
    else if( this->m_cur_val == sc_dt::SC_LOGIC_0 ) {
        sc_signal_channel::notify_next_delta( m_negedge_event_p );
    }
}